

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
::
emplace_new_key<std::__cxx11::string,ska::flat_hash_map<std::__cxx11::string,slang::ast::ParamOverrideNode,slang::Hasher<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          convertible_to_value *args)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
  pVar7;
  bool local_d5 [13];
  templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>
  local_c8;
  iterator result;
  value_type to_insert;
  templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>
  local_58 [3];
  convertible_to_value *local_40;
  convertible_to_value *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  *this_local;
  bool local_10;
  
  local_40 = args;
  args_local = (convertible_to_value *)key;
  key_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 8) != 0) &&
     ((sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
       )distance_from_desired != this[0x11])) {
    lVar3 = *(long *)(this + 0x18) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 8) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x14)) {
      bVar1 = sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>
              ::is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>::
        emplace<std::__cxx11::string,ska::flat_hash_map<std::__cxx11::string,slang::ast::ParamOverrideNode,slang::Hasher<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>::convertible_to_value>
                  ((sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>
                    *)key_local,(int8_t)current_entry_local._7_1_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local,
                   local_40);
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
        ::
        templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>
        ::templated_iterator(local_58,(EntryPointer)key_local);
        to_insert.second.childNodes.
        super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
        .num_elements._7_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
                            *)&this_local,local_58,
                           (bool *)((long)&to_insert.second.childNodes.
                                           super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                                           .num_elements + 7));
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ska::flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>::convertible_to_value,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                    *)&result,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local,
                   local_40);
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::swap<std::__cxx11::string,slang::ast::ParamOverrideNode>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                    *)&result,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                    *)&key_local->_M_string_length);
        sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
        ::
        templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>
        ::templated_iterator(&local_c8,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &key_local[3]._M_string_length;
            bVar1 = sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>
                    ::is_empty((sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>
                                *)key_local);
            if (bVar1) {
              sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>::
              emplace<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>
                        ((sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>
                          *)key_local,(int8_t)current_entry_local._7_1_,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                          *)&result);
              *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
              local_d5[0] = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
                          *)&this_local,&local_c8,local_d5);
              goto LAB_003acaa6;
            }
            if ((char)current_entry_local._7_1_ <= (char)key_local->_M_dataplus) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::swap<std::__cxx11::string,slang::ast::ParamOverrideNode>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                        *)&result,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                        *)&key_local->_M_string_length);
            current_entry_local._7_1_ =
                 (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x11]);
        std::swap<std::__cxx11::string,slang::ast::ParamOverrideNode>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                    *)&result,&((local_c8.current)->field_1).value);
        sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
        ::grow((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                *)this);
        pVar6 = emplace<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>
                          (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                                 *)&result);
        this_local = (sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                      *)pVar6.first.current;
        local_10 = pVar6.second;
LAB_003acaa6:
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                 *)&result);
        pVar6._8_8_ = extraout_RDX_00;
        pVar6.first.current = (EntryPointer)this_local;
      }
      goto LAB_003acab2;
    }
  }
  sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  ::grow((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
          *)this);
  pVar6 = emplace<std::__cxx11::string,ska::flat_hash_map<std::__cxx11::string,slang::ast::ParamOverrideNode,slang::Hasher<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>::convertible_to_value>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          args_local,local_40);
  local_10 = pVar6.second;
LAB_003acab2:
  this_local = (sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }